

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O1

iMultiFab *
amrex::makeFineMask<amrex::IArrayBox>
          (iMultiFab *__return_storage_ptr__,FabArray<amrex::IArrayBox> *cmf,
          FabArray<amrex::IArrayBox> *fmf,IntVect *cnghost,IntVect *ratio,Periodicity *period,
          int crse_value,int fine_value,LayoutData<int> *has_cf)

{
  CPC *thecmd;
  iMultiFab foo;
  FabFactory<amrex::IArrayBox> local_300;
  MFInfo local_2f8;
  LayoutData<int> local_2c8;
  undefined1 local_1b8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8 [15];
  
  local_1b8._0_8_ = (_func_int **)0x1;
  local_1b8._8_8_ = (Arena *)0x0;
  local_1a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)&PTR__FabFactory_0074f4c0;
  iMultiFab::iMultiFab
            (__return_storage_ptr__,&(cmf->super_FabArrayBase).boxarray,
             &(cmf->super_FabArrayBase).distributionMap,1,cnghost,(MFInfo *)local_1b8,
             (FabFactory<amrex::IArrayBox> *)&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1a8);
  FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>
            (&__return_storage_ptr__->super_FabArray<amrex::IArrayBox>,crse_value,0,
             (__return_storage_ptr__->super_FabArray<amrex::IArrayBox>).super_FabArrayBase.n_comp,
             &(__return_storage_ptr__->super_FabArray<amrex::IArrayBox>).super_FabArrayBase.n_grow);
  coarsen((BoxArray *)&local_2c8,&(fmf->super_FabArrayBase).boxarray,ratio);
  local_2f8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.alloc = false;
  local_2f8._1_7_ = 0;
  local_2f8.arena = (Arena *)0x0;
  local_2f8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_300._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0074f4c0;
  iMultiFab::iMultiFab
            ((iMultiFab *)local_1b8,(BoxArray *)&local_2c8,
             &(fmf->super_FabArrayBase).distributionMap,1,0,&local_2f8,&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f8.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  BoxArray::~BoxArray((BoxArray *)&local_2c8);
  local_2c8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
  local_2c8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  thecmd = FabArrayBase::getCPC
                     ((FabArrayBase *)__return_storage_ptr__,cnghost,(FabArrayBase *)local_1b8,
                      (IntVect *)&local_2c8,period,false);
  FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>
            (&__return_storage_ptr__->super_FabArray<amrex::IArrayBox>,fine_value,
             &thecmd->super_CommMetaData,0,1);
  FabArray<amrex::IArrayBox>::RecvLayoutMask<amrex::IArrayBox,_0>
            (&local_2c8,&__return_storage_ptr__->super_FabArray<amrex::IArrayBox>,
             &thecmd->super_CommMetaData);
  LayoutData<int>::operator=(has_cf,&local_2c8);
  LayoutData<int>::~LayoutData(&local_2c8);
  iMultiFab::~iMultiFab((iMultiFab *)local_1b8);
  return __return_storage_ptr__;
}

Assistant:

iMultiFab
makeFineMask (const FabArray<FAB>& cmf, const FabArray<FAB>& fmf,
              const IntVect& cnghost, const IntVect& ratio,
              Periodicity const& period, int crse_value, int fine_value,
              LayoutData<int>& has_cf)
{
    iMultiFab mask(cmf.boxArray(), cmf.DistributionMap(), 1, cnghost);
    mask.setVal(crse_value);

    iMultiFab foo(amrex::coarsen(fmf.boxArray(),ratio), fmf.DistributionMap(),
                  1, 0, MFInfo().SetAlloc(false));
    const FabArrayBase::CPC& cpc = mask.getCPC(cnghost,foo,IntVect::TheZeroVector(),period);
    mask.setVal(fine_value, cpc, 0, 1);

    has_cf = mask.RecvLayoutMask(cpc);

    return mask;
}